

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QBenchmarkResult>::reserve(QList<QBenchmarkResult> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  QGenericArrayOps<QBenchmarkResult> *this_00;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QBenchmarkResult> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  QBenchmarkResult *in_stack_ffffffffffffff60;
  QArrayDataPointer<QBenchmarkResult> *in_stack_ffffffffffffff68;
  QBenchmarkResult *b;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QBenchmarkResult> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  undefined1 local_38 [36];
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = capacity((QList<QBenchmarkResult> *)0x11fa25);
  qVar4 = QArrayDataPointer<QBenchmarkResult>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar3 - qVar4) {
    QArrayDataPointer<QBenchmarkResult>::operator->(in_RDI);
    local_38._32_4_ =
         QArrayDataPointer<QBenchmarkResult>::flags
                   ((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_0011fc00;
    QArrayDataPointer<QBenchmarkResult>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QBenchmarkResult>::isShared
                      ((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QBenchmarkResult>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QBenchmarkResult>::setFlag
                ((QArrayDataPointer<QBenchmarkResult> *)0x11fade,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_0011fc00;
    }
  }
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QBenchmarkResult> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  b = (QBenchmarkResult *)local_38;
  QArrayDataPointer<QBenchmarkResult>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)b >> 0x20));
  this_00 = (QGenericArrayOps<QBenchmarkResult> *)
            QArrayDataPointer<QBenchmarkResult>::operator->
                      ((QArrayDataPointer<QBenchmarkResult> *)b);
  QArrayDataPointer<QBenchmarkResult>::operator->(in_RDI);
  QArrayDataPointer<QBenchmarkResult>::begin((QArrayDataPointer<QBenchmarkResult> *)0x11fb60);
  QArrayDataPointer<QBenchmarkResult>::operator->(in_RDI);
  QArrayDataPointer<QBenchmarkResult>::end
            ((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QBenchmarkResult>::copyAppend(this_00,b,in_stack_ffffffffffffff60);
  pDVar5 = QArrayDataPointer<QBenchmarkResult>::d_ptr
                     ((QArrayDataPointer<QBenchmarkResult> *)local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (QBenchmarkResult *)
         QArrayDataPointer<QBenchmarkResult>::operator->
                   ((QArrayDataPointer<QBenchmarkResult> *)local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QBenchmarkResult>::setFlag
              ((QArrayDataPointer<QBenchmarkResult> *)0x11fbc7,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QBenchmarkResult>::swap
            ((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff60,
             (QArrayDataPointer<QBenchmarkResult> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QBenchmarkResult>::~QArrayDataPointer
            ((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff60);
LAB_0011fc00:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}